

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O1

void __thiscall QAbstractButton::setChecked(QAbstractButton *this,bool checked)

{
  byte bVar1;
  QAbstractButtonPrivate *this_00;
  QButtonGroup *pQVar2;
  QAbstractButton *pQVar3;
  int *piVar4;
  byte bVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QAccessibleStateChangeEvent event;
  code *local_58;
  undefined8 uStack_50;
  QAbstractButton *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8;
  bVar5 = this_00->field_0x28c;
  if (((bVar5 & 1) == 0) || (((bVar5 & 2) == 0) != checked)) {
    if ((bVar5 & 0x20) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        (**(code **)(*(long *)&this->super_QWidget + 0x1a8))(this);
        return;
      }
      goto LAB_003c439d;
    }
  }
  else {
    bVar5 = 2;
    if (!checked) {
      pQVar3 = QAbstractButtonPrivate::queryCheckedButton(this_00);
      if (pQVar3 == this) {
        pQVar2 = this_00->group;
        if (pQVar2 == (QButtonGroup *)0x0) {
          bVar5 = (byte)this_00->field_0x28c >> 3 & 1;
        }
        else {
          bVar5 = *(byte *)(*(long *)&pQVar2->field_0x8 + 0xa0);
        }
        if (bVar5 != 0) goto LAB_003c4369;
        if (pQVar2 != (QButtonGroup *)0x0) {
          QButtonGroupPrivate::detectCheckedButton(*(QButtonGroupPrivate **)&pQVar2->field_0x8);
        }
      }
      bVar5 = 0;
    }
    piVar4 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
    bVar1 = this_00->field_0x28c;
    this_00->field_0x28c = bVar1 & 0xfd | bVar5;
    if ((bVar1 & 0x20) == 0) {
      (**(code **)(*(long *)&this->super_QWidget + 0x1a8))(this);
    }
    if ((this_00->field_0x28c & 0x20) == 0) {
      QWidget::update(*(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8);
    }
    if (piVar4 == (int *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = piVar4[1] == 0;
    }
    if (checked && !bVar6) {
      QAbstractButtonPrivate::notifyChecked(this_00);
    }
    if (piVar4 != (int *)0x0) {
      if (piVar4[1] != 0) {
        QAbstractButtonPrivate::emitToggled(this_00,checked);
      }
      if (piVar4 != (int *)0x0) {
        if (piVar4[1] != 0) {
          uStack_40 = 0xaaaaaaaaffffffff;
          local_58 = QCss::ValueExtractor::extractGeometry;
          local_38 = 0x40;
          uStack_50 = 0xaaaaaaaa0000800a;
          local_48 = this;
          QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
          QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
                    ((QAccessibleStateChangeEvent *)&local_58);
        }
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            operator_delete(piVar4);
          }
        }
      }
    }
  }
LAB_003c4369:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_003c439d:
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::setChecked(bool checked)
{
    Q_D(QAbstractButton);
    if (!d->checkable || d->checked == checked) {
        if (!d->blockRefresh)
            checkStateSet();
        return;
    }

    if (!checked && d->queryCheckedButton() == this) {
        // the checked button of an exclusive or autoexclusive group cannot be  unchecked
#if QT_CONFIG(buttongroup)
        if (d->group ? d->group->d_func()->exclusive : d->autoExclusive)
            return;
        if (d->group)
            d->group->d_func()->detectCheckedButton();
#else
        if (d->autoExclusive)
            return;
#endif
    }

    QPointer<QAbstractButton> guard(this);

    d->checked = checked;
    if (!d->blockRefresh)
        checkStateSet();
    d->refresh();

    if (guard && checked)
        d->notifyChecked();
    if (guard)
        d->emitToggled(checked);

#if QT_CONFIG(accessibility)
    if (guard) {
        QAccessible::State s;
        s.checked = true;
        QAccessibleStateChangeEvent event(this, s);
        QAccessible::updateAccessibility(&event);
    }
#endif
}